

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O0

void vepu510_h265_set_scaling_list(H265eV510HalContext *ctx)

{
  H265eV510RegSet *pHVar1;
  uint uVar2;
  byte local_35;
  RK_U8 idx;
  RK_U32 scl_lst_sel;
  RK_U8 *p;
  Vepu510SclCfg *s;
  H265eV510RegSet *regs;
  Vepu510H265eFrmCfg *frm_cfg;
  H265eV510HalContext *ctx_local;
  
  pHVar1 = ctx->frm->regs_set;
  uVar2 = (uint)(pHVar1->reg_frm).rdo_cfg >> 0x18 & 3;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","enter\n","vepu510_h265_set_scaling_list");
  }
  if (uVar2 == 1) {
    for (local_35 = 0; local_35 < 0x40; local_35 = local_35 + 1) {
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(uint)local_35) =
           vepu510_h265_cqm_intra8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x40)) =
           vepu510_h265_cqm_intra8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x80)) =
           vepu510_h265_cqm_intra8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0xc0)) =
           vepu510_h265_cqm_inter8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x100)) =
           vepu510_h265_cqm_inter8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x140)) =
           vepu510_h265_cqm_inter8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x180)) =
           vepu510_h265_cqm_intra8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x1c0)) =
           vepu510_h265_cqm_intra8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x200)) =
           vepu510_h265_cqm_intra8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x240)) =
           vepu510_h265_cqm_inter8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x280)) =
           vepu510_h265_cqm_inter8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x2c0)) =
           vepu510_h265_cqm_inter8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x300)) =
           vepu510_h265_cqm_intra8[(int)(0x3f - (uint)local_35)];
      *(RK_U8 *)((long)(pHVar1->reg_scl).tu8_intra_y + (long)(int)(local_35 + 0x340)) =
           vepu510_h265_cqm_inter8[(int)(0x3f - (uint)local_35)];
    }
    (pHVar1->reg_scl).tu_dc0 =
         (anon_struct_4_4_de79af00_for_tu_dc0)((uint)(pHVar1->reg_scl).tu_dc0 & 0xffffff00 | 0x10);
    (pHVar1->reg_scl).tu_dc0 =
         (anon_struct_4_4_de79af00_for_tu_dc0)((uint)(pHVar1->reg_scl).tu_dc0 & 0xffff00ff | 0x1000)
    ;
    (pHVar1->reg_scl).tu_dc0 =
         (anon_struct_4_4_de79af00_for_tu_dc0)
         ((uint)(pHVar1->reg_scl).tu_dc0 & 0xff00ffff | 0x100000);
    (pHVar1->reg_scl).tu_dc0 =
         (anon_struct_4_4_de79af00_for_tu_dc0)
         ((uint)(pHVar1->reg_scl).tu_dc0 & 0xffffff | 0x10000000);
    (pHVar1->reg_scl).tu_dc1 =
         (anon_struct_4_4_7003d19e_for_tu_dc1)((uint)(pHVar1->reg_scl).tu_dc1 & 0xffffff00 | 0x10);
    (pHVar1->reg_scl).tu_dc1 =
         (anon_struct_4_4_7003d19e_for_tu_dc1)((uint)(pHVar1->reg_scl).tu_dc1 & 0xffff00ff | 0x1000)
    ;
    (pHVar1->reg_scl).tu_dc1 =
         (anon_struct_4_4_7003d19e_for_tu_dc1)
         ((uint)(pHVar1->reg_scl).tu_dc1 & 0xff00ffff | 0x100000);
    (pHVar1->reg_scl).tu_dc1 =
         (anon_struct_4_4_7003d19e_for_tu_dc1)
         ((uint)(pHVar1->reg_scl).tu_dc1 & 0xffffff | 0x10000000);
  }
  else if (uVar2 == 2) {
    _mpp_log_l(4,"hal_h265e_v510","scaling_list_mode 2 is not supported yet\n",
               "vepu510_h265_set_scaling_list");
  }
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","leave\n","vepu510_h265_set_scaling_list");
  }
  return;
}

Assistant:

static void vepu510_h265_set_scaling_list(H265eV510HalContext *ctx)
{
    Vepu510H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV510RegSet *regs = frm_cfg->regs_set;
    Vepu510SclCfg *s = &regs->reg_scl;
    RK_U8 *p = (RK_U8 *)&s->tu8_intra_y[0];
    RK_U32 scl_lst_sel = regs->reg_frm.rdo_cfg.scl_lst_sel;
    RK_U8 idx;

    hal_h265e_dbg_func("enter\n");

    if (scl_lst_sel == 1) {
        for (idx = 0; idx < 64; idx++) {
            /* TU8 intra Y/U/V */
            p[idx + 64 * 0] = vepu510_h265_cqm_intra8[63 - idx];
            p[idx + 64 * 1] = vepu510_h265_cqm_intra8[63 - idx];
            p[idx + 64 * 2] = vepu510_h265_cqm_intra8[63 - idx];

            /* TU8 inter Y/U/V */
            p[idx + 64 * 3] = vepu510_h265_cqm_inter8[63 - idx];
            p[idx + 64 * 4] = vepu510_h265_cqm_inter8[63 - idx];
            p[idx + 64 * 5] = vepu510_h265_cqm_inter8[63 - idx];

            /* TU16 intra Y/U/V AC */
            p[idx + 64 * 6] = vepu510_h265_cqm_intra8[63 - idx];
            p[idx + 64 * 7] = vepu510_h265_cqm_intra8[63 - idx];
            p[idx + 64 * 8] = vepu510_h265_cqm_intra8[63 - idx];

            /* TU16 inter Y/U/V AC */
            p[idx + 64 *  9] = vepu510_h265_cqm_inter8[63 - idx];
            p[idx + 64 * 10] = vepu510_h265_cqm_inter8[63 - idx];
            p[idx + 64 * 11] = vepu510_h265_cqm_inter8[63 - idx];

            /* TU32 intra/inter Y AC */
            p[idx + 64 * 12] = vepu510_h265_cqm_intra8[63 - idx];
            p[idx + 64 * 13] = vepu510_h265_cqm_inter8[63 - idx];
        }

        s->tu_dc0.tu16_intra_y_dc = 16;
        s->tu_dc0.tu16_intra_u_dc = 16;
        s->tu_dc0.tu16_intra_v_dc = 16;
        s->tu_dc0.tu16_inter_y_dc = 16;
        s->tu_dc1.tu16_inter_u_dc = 16;
        s->tu_dc1.tu16_inter_v_dc = 16;
        s->tu_dc1.tu32_intra_y_dc = 16;
        s->tu_dc1.tu32_inter_y_dc = 16;
    } else if (scl_lst_sel == 2) {
        //TODO: Update scaling list for (scaling_list_mode == 2)
        mpp_log_f("scaling_list_mode 2 is not supported yet\n");
    }

    hal_h265e_dbg_func("leave\n");
}